

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

size_t mdns_records_parse(sockaddr *from,void *buffer,size_t size,size_t *offset,
                         mdns_entry_type_t type,size_t records,mdns_record_callback_fn callback,
                         void *user_data)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  size_t local_48;
  
  if (records == 0) {
    local_48 = 0;
  }
  else {
    bVar8 = true;
    local_48 = 0;
    do {
      mdns_string_skip(buffer,size,offset);
      sVar6 = *offset;
      uVar1 = *(ushort *)((long)buffer + sVar6);
      uVar2 = *(ushort *)((long)buffer + sVar6 + 2);
      uVar4 = *(uint *)((long)buffer + sVar6 + 4);
      uVar3 = *(ushort *)((long)buffer + sVar6 + 8);
      sVar6 = sVar6 + 10;
      *offset = sVar6;
      uVar7 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
      if (bVar8) {
        local_48 = local_48 + 1;
        iVar5 = (*callback)(from,type,uVar1 << 8 | uVar1 >> 8,uVar2 << 8 | uVar2 >> 8,
                            uVar4 << 8 | uVar4 >> 8 & 0xff,buffer,size,sVar6,uVar7,user_data);
        bVar8 = iVar5 == 0;
        sVar6 = *offset;
      }
      else {
        bVar8 = false;
      }
      *offset = uVar7 + sVar6;
      records = records - 1;
    } while (records != 0);
  }
  return local_48;
}

Assistant:

size_t
mdns_records_parse(const struct sockaddr* from, const void* buffer, size_t size, size_t* offset,
                   mdns_entry_type_t type, size_t records, mdns_record_callback_fn callback,
                   void* user_data) {
	size_t parsed = 0;
	int do_callback = 1;
	for (size_t i = 0; i < records; ++i) {
		mdns_string_skip(buffer, size, offset);
		const uint16_t* data = (const uint16_t*)((const char*)buffer + (*offset));

		uint16_t rtype = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);
		uint32_t ttl = ntohs(*(const uint32_t*)(const void*)data); data += 2;
		uint16_t length = ntohs(*data++);

		*offset += 10;

		if (do_callback) {
			++parsed;
			if (callback(from, type, rtype, rclass, ttl, buffer, size, *offset, length,
			             user_data))
				do_callback = 0;
		}

		*offset += length;
	}
	return parsed;
}